

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data_unittest.cc
# Opt level: O2

void bssl::anon_unknown_0::RunTestCase
               (VerifyResult expected_result,char *file_name,SignatureVerifyCache *cache)

{
  Input input;
  Input signed_data_00;
  Input algorithm_identifier;
  Input public_key_spki;
  optional<bssl::SignatureAlgorithm> oVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *message;
  char *in_R9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  bool result;
  AssertionResult gtest_ar__2;
  bool expected_result_bool;
  AssertionResult gtest_ar_;
  Parser signature_value_parser;
  optional<bssl::der::BitString> signature_value_bit_string;
  string signature_value;
  string signed_data;
  string algorithm;
  string public_key;
  string path;
  PemBlockMapping mappings [4];
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)mappings,"testdata/verify_signed_data_unittest/",
             (allocator<char> *)&public_key);
  ::std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         mappings,file_name);
  ::std::__cxx11::string::~string((string *)mappings);
  public_key._M_dataplus._M_p = (pointer)&public_key.field_2;
  public_key._M_string_length = 0;
  algorithm._M_dataplus._M_p = (pointer)&algorithm.field_2;
  algorithm._M_string_length = 0;
  signed_data._M_dataplus._M_p = (pointer)&signed_data.field_2;
  signed_data._M_string_length = 0;
  public_key.field_2._M_local_buf[0] = '\0';
  algorithm.field_2._M_local_buf[0] = '\0';
  signed_data.field_2._M_local_buf[0] = '\0';
  signature_value._M_dataplus._M_p = (pointer)&signature_value.field_2;
  signature_value._M_string_length = 0;
  signature_value.field_2._M_local_buf[0] = '\0';
  mappings[0].block_name = "PUBLIC KEY";
  mappings[0].optional = false;
  mappings[1].block_name = "ALGORITHM";
  mappings[1].value = &algorithm;
  mappings[1].optional = false;
  mappings[2].block_name = "DATA";
  mappings[2].value = &signed_data;
  mappings[2].optional = false;
  mappings[3].block_name = "SIGNATURE";
  mappings[3].value = &signature_value;
  mappings[3].optional = false;
  mappings[0].value = &public_key;
  ReadTestDataFromPemFile<4ul>((bssl *)&gtest_ar_,&path,&mappings);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&signature_value_parser);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&signature_value_bit_string,(internal *)&gtest_ar_,
               (AssertionResult *)"ReadTestDataFromPemFile(path, mappings)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
               ,0x43,(char *)signature_value_bit_string.
                             super__Optional_base<bssl::der::BitString,_true,_true>._M_payload.
                             super__Optional_payload_base<bssl::der::BitString>._M_payload._M_value.
                             bytes_.data_.data_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__2,(Message *)&signature_value_parser);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    ::std::__cxx11::string::~string((string *)&signature_value_bit_string);
LAB_0034ab74:
    if ((long *)signature_value_parser.cbs_.data != (long *)0x0) {
      (**(code **)(*(long *)signature_value_parser.cbs_.data + 8))();
    }
LAB_0034ab7f:
    this = &gtest_ar_.message_;
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    algorithm_identifier.data_.size_ = algorithm._M_string_length;
    algorithm_identifier.data_.data_ = (uchar *)algorithm._M_dataplus._M_p;
    oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
    this = &gtest_ar_.message_;
    gtest_ar_.success_ =
         oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
         super__Optional_payload_base<bssl::SignatureAlgorithm>._M_engaged;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0) {
      testing::Message::Message((Message *)&signature_value_parser);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&signature_value_bit_string,(internal *)&gtest_ar_,
                 (AssertionResult *)"signature_algorithm","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                 ,0x47,(char *)signature_value_bit_string.
                               super__Optional_base<bssl::der::BitString,_true,_true>._M_payload.
                               super__Optional_payload_base<bssl::der::BitString>._M_payload.
                               _M_value.bytes_.data_.data_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__2,(Message *)&signature_value_parser);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
      ::std::__cxx11::string::~string((string *)&signature_value_bit_string);
      local_1a8._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )signature_value_parser.cbs_.data;
    }
    else {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this);
      input.data_.size_ = signature_value._M_string_length;
      input.data_.data_ = (uchar *)signature_value._M_dataplus._M_p;
      bssl::der::Parser::Parser(&signature_value_parser,input);
      bssl::der::Parser::ReadBitString(&signature_value_bit_string,&signature_value_parser);
      this = &gtest_ar__2.message_;
      gtest_ar__2.success_ =
           signature_value_bit_string.super__Optional_base<bssl::der::BitString,_true,_true>.
           _M_payload.super__Optional_payload_base<bssl::der::BitString>._M_engaged;
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (signature_value_bit_string.super__Optional_base<bssl::der::BitString,_true,_true>.
          _M_payload.super__Optional_payload_base<bssl::der::BitString>._M_engaged != false) {
        ::std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this);
        expected_result_bool = expected_result == SUCCESS;
        if (signature_value_bit_string.super__Optional_base<bssl::der::BitString,_true,_true>.
            _M_payload.super__Optional_payload_base<bssl::der::BitString>._M_engaged == false) {
          ::std::__throw_bad_optional_access();
        }
        signed_data_00.data_.size_ = signed_data._M_string_length;
        signed_data_00.data_.data_ = (uchar *)signed_data._M_dataplus._M_p;
        public_key_spki.data_.size_ = public_key._M_string_length;
        public_key_spki.data_.data_ = (uchar *)public_key._M_dataplus._M_p;
        result = VerifySignedData(oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
                                  _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm>.
                                  _M_payload,signed_data_00,(BitString *)&signature_value_bit_string
                                  ,public_key_spki,cache);
        testing::internal::CmpHelperEQ<bool,bool>
                  ((internal *)&gtest_ar_,"expected_result_bool","result",&expected_result_bool,
                   &result);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__2);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            message = "";
          }
          else {
            message = *(char **)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                     ,0x55,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1a8,(Message *)&gtest_ar__2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
          signature_value_parser.cbs_.data =
               (uint8_t *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_);
          goto LAB_0034ab74;
        }
        goto LAB_0034ab7f;
      }
      testing::Message::Message((Message *)&local_1a8);
      ::std::operator<<((ostream *)
                        ((long)local_1a8._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x10),"The signature value is not a valid BIT STRING"
                       );
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
                 (AssertionResult *)"signature_value_bit_string.has_value()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&expected_result_bool,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_signed_data_unittest.cc"
                 ,0x4c,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&expected_result_bool,(Message *)&local_1a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expected_result_bool);
      ::std::__cxx11::string::~string((string *)&gtest_ar_);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1a8._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1a8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
  ::std::__cxx11::string::~string((string *)&signature_value);
  ::std::__cxx11::string::~string((string *)&signed_data);
  ::std::__cxx11::string::~string((string *)&algorithm);
  ::std::__cxx11::string::~string((string *)&public_key);
  ::std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void RunTestCase(VerifyResult expected_result, const char *file_name,
                 SignatureVerifyCache *cache) {
  std::string path =
      std::string("testdata/verify_signed_data_unittest/") + file_name;

  std::string public_key;
  std::string algorithm;
  std::string signed_data;
  std::string signature_value;

  const PemBlockMapping mappings[] = {
      {"PUBLIC KEY", &public_key},
      {"ALGORITHM", &algorithm},
      {"DATA", &signed_data},
      {"SIGNATURE", &signature_value},
  };

  ASSERT_TRUE(ReadTestDataFromPemFile(path, mappings));

  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(StringAsBytes(algorithm));
  ASSERT_TRUE(signature_algorithm);

  der::Parser signature_value_parser(StringAsBytes(signature_value));
  std::optional<der::BitString> signature_value_bit_string =
      signature_value_parser.ReadBitString();
  ASSERT_TRUE(signature_value_bit_string.has_value())
      << "The signature value is not a valid BIT STRING";

  bool expected_result_bool = expected_result == SUCCESS;

  bool result = VerifySignedData(
      *signature_algorithm, StringAsBytes(signed_data),
      signature_value_bit_string.value(), StringAsBytes(public_key), cache);

  EXPECT_EQ(expected_result_bool, result);
}